

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.cpp
# Opt level: O2

shared_ptr<mocker::ast::Type> __thiscall
mocker::ir::BuilderContext::getExprType(BuilderContext *this,NodeID id)

{
  __shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Type> sVar2;
  key_type local_10;
  
  p_Var1 = &std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at(*(_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   **)(id + 0x58),&local_10)->
            super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var1);
  sVar2.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Type>)
         sVar2.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::shared_ptr<ast::Type>
BuilderContext::getExprType(ast::NodeID id) const {
  return exprType.at(id);
}